

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_server_assert(http_server_t *server)

{
  http_server_t *server_local;
  
  if (server == (http_server_t *)0x0) {
    __assert_fail("server != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x1b,
                  "void http_server_assert(http_server_t *)");
  }
  if (server->clients != (http_client_t *)0x0) {
    if ((server->max_clients != 0) && (server->max_clients < server->count_clients)) {
      __assert_fail("(server->max_clients == 0) || (server->count_clients <= server->max_clients)",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x1e,
                    "void http_server_assert(http_server_t *)");
    }
    if (server->count_clients <= server->num_clients) {
      return;
    }
    __assert_fail("server->count_clients <= server->num_clients",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x1f,
                  "void http_server_assert(http_server_t *)");
  }
  __assert_fail("server->clients != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x1c,
                "void http_server_assert(http_server_t *)");
}

Assistant:

static void http_server_assert(http_server_t *server) {
  assert(server != NULL);
  assert(server->clients != NULL);
  assert((server->max_clients == 0) ||
         (server->count_clients <= server->max_clients));
  assert(server->count_clients <= server->num_clients);
}